

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O1

off_t mem_seek(hFILE *fpv,off_t offset,int whence)

{
  long lVar1;
  ulong uVar2;
  int *piVar3;
  ulong uVar4;
  
  uVar4 = -offset;
  if (0 < offset) {
    uVar4 = offset;
  }
  if (whence == 0) {
    uVar2 = 0;
  }
  else {
    if (whence == 1) {
      lVar1 = 0x48;
    }
    else {
      if (whence != 2) goto LAB_001117c1;
      lVar1 = 0x40;
    }
    uVar2 = *(ulong *)((long)&fpv->buffer + lVar1);
  }
  if ((-1 < offset || uVar4 <= uVar2) && ((offset < 0 || (uVar4 <= (long)fpv[1].begin - uVar2)))) {
    fpv[1].end = (char *)(uVar2 + offset);
    return (off_t)(char *)(uVar2 + offset);
  }
LAB_001117c1:
  piVar3 = __errno_location();
  *piVar3 = 0x16;
  return -1;
}

Assistant:

static off_t mem_seek(hFILE *fpv, off_t offset, int whence)
{
    hFILE_mem *fp = (hFILE_mem *) fpv;
    size_t absoffset = (offset >= 0)? offset : -offset;
    size_t origin;

    switch (whence) {
    case SEEK_SET: origin = 0; break;
    case SEEK_CUR: origin = fp->pos; break;
    case SEEK_END: origin = fp->length; break;
    default: errno = EINVAL; return -1;
    }

    if ((offset  < 0 && absoffset > origin) ||
        (offset >= 0 && absoffset > fp->length - origin)) {
        errno = EINVAL;
        return -1;
    }

    fp->pos = origin + offset;
    return fp->pos;
}